

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O0

void __thiscall
VTKUnstructuredGrid<MercuryParticle<2ul>>::write<MercuryTimeStep<2ul>>
          (VTKUnstructuredGrid<MercuryParticle<2UL>_> *this,MercuryTimeStep<2UL> *container)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  reference ppVVar6;
  undefined4 extraout_var;
  reference pMVar7;
  MercuryTimeStep<2UL> *in_RSI;
  long *in_RDI;
  MercuryParticle<2UL> *mem_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  MercuryTimeStep<2UL> *__range3;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *descr;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  *__range2_1;
  MercuryParticle<2UL> *mem;
  const_iterator __end0;
  const_iterator __begin0;
  MercuryTimeStep<2UL> *__range2;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *pDescr;
  MercuryTimeStep<2UL> *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffe90;
  __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
  local_d8;
  MercuryTimeStep<2UL> *local_d0;
  string local_c8 [32];
  string local_a8 [32];
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *local_88;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> **local_80;
  __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*const_*,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
  local_78;
  long local_70;
  reference local_68;
  MercuryParticle<2UL> *local_60;
  __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
  local_58;
  MercuryTimeStep<2UL> *local_50;
  string local_38 [32];
  long *local_18;
  MercuryTimeStep<2UL> *local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<((ostream *)(in_RDI + 1),
                           "<?xml version=\"1.0\"?>\n<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n <UnstructuredGrid>\n  <Piece NumberOfPoints=\""
                          );
  sVar4 = MercuryTimeStep<2UL>::size(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::operator<<(poVar3,
                  "\" NumberOfCells=\"0\">\n   <Cells>\n    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n       1\n    </DataArray>\n   </Cells>\n   <Points>\n"
                 );
  local_18 = *(long **)(*in_RDI + 0x18);
  poVar3 = std::operator<<((ostream *)(in_RDI + 1),"<DataArray type=\"");
  (**(code **)(*local_18 + 0x18))();
  poVar3 = std::operator<<(poVar3,local_38);
  poVar3 = std::operator<<(poVar3,"\" NumberOfComponents=\"");
  uVar5 = (**(code **)(*local_18 + 0x20))();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
  std::operator<<(poVar3,"\" format=\"ascii\">\n");
  std::__cxx11::string::~string(local_38);
  local_50 = local_10;
  local_58._M_current =
       (MercuryParticle<2UL> *)MercuryTimeStep<2UL>::begin(in_stack_fffffffffffffe88);
  local_60 = (MercuryParticle<2UL> *)MercuryTimeStep<2UL>::end(in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
               ::operator*(&local_58);
    (**(code **)(*local_18 + 0x10))(local_18,in_RDI + 1,local_68);
    __gnu_cxx::
    __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
    ::operator++(&local_58);
  }
  std::operator<<((ostream *)(in_RDI + 1),"\n</DataArray>\n");
  std::operator<<((ostream *)(in_RDI + 1),"    </Points>\n    <PointData>\n");
  local_70 = *in_RDI;
  local_78._M_current =
       (VTKPointDescriptorEntry<MercuryParticle<2UL>_> **)
       std::
       vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
       ::begin((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                *)in_stack_fffffffffffffe88);
  local_80 = (VTKPointDescriptorEntry<MercuryParticle<2UL>_> **)
             std::
             vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
             ::end((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                    *)in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*const_*,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*const_*,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    ppVVar6 = __gnu_cxx::
              __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*const_*,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
              ::operator*(&local_78);
    local_88 = *ppVVar6;
    poVar3 = std::operator<<((ostream *)(in_RDI + 1),"<DataArray type=\"");
    (*local_88->_vptr_VTKPointDescriptorEntry[3])();
    poVar3 = std::operator<<(poVar3,local_a8);
    poVar3 = std::operator<<(poVar3,"\" Name=\"");
    Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>::getName_abi_cxx11_
              ((VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)in_stack_fffffffffffffe88);
    poVar3 = std::operator<<(poVar3,local_c8);
    poVar3 = std::operator<<(poVar3,"\" NumberOfComponents=\"");
    iVar2 = (*local_88->_vptr_VTKPointDescriptorEntry[4])();
    in_stack_fffffffffffffe90 =
         (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var,iVar2));
    std::operator<<(in_stack_fffffffffffffe90,"\" format=\"ascii\">\n");
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    local_d0 = local_10;
    local_d8._M_current =
         (MercuryParticle<2UL> *)MercuryTimeStep<2UL>::begin(in_stack_fffffffffffffe88);
    MercuryTimeStep<2UL>::end(in_stack_fffffffffffffe88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar1) break;
      pMVar7 = __gnu_cxx::
               __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
               ::operator*(&local_d8);
      (*local_88->_vptr_VTKPointDescriptorEntry[2])(local_88,in_RDI + 1,pMVar7);
      __gnu_cxx::
      __normal_iterator<const_MercuryParticle<2UL>_*,_std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>_>
      ::operator++(&local_d8);
    }
    std::operator<<((ostream *)(in_RDI + 1),"\n</DataArray>\n");
    __gnu_cxx::
    __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*const_*,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
    ::operator++(&local_78);
  }
  std::operator<<((ostream *)(in_RDI + 1),
                  "   </PointData>\n   <CellData/>\n  </Piece>\n </UnstructuredGrid>\n</VTKFile>\n")
  ;
  return;
}

Assistant:

void write(const C& container)
  {
    outFile_ <<
      "<?xml version=\"1.0\"?>\n"
       "<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n"
       " <UnstructuredGrid>\n"
       "  <Piece NumberOfPoints=\"" << container.size() << "\" NumberOfCells=\"0\">\n"
       "   <Cells>\n"
       "    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n"
       "       1\n"
       "    </DataArray>\n"
       "   </Cells>\n"
       "   <Points>\n";
    Detail::VTKPointDescriptorEntry<T>* pDescr = descriptor_->positionEntry_;
    outFile_ << "<DataArray type=\"" << pDescr->getTypeName() << "\" "
                "NumberOfComponents=\"" << pDescr->getNumberOfComponents() << "\" "
                "format=\"ascii\">\n";
    for (const T& mem : container)
    {
      pDescr->emit(outFile_, mem);
    }
    outFile_ << "\n</DataArray>\n";
    
    outFile_ <<
      "    </Points>\n"
      "    <PointData>\n";
    
    for (Detail::VTKPointDescriptorEntry<T>* descr : descriptor_->entries_)
    {
      outFile_ << "<DataArray type=\""    << descr->getTypeName() << "\" "
                  "Name=\""               << descr->getName() << "\" "
                  "NumberOfComponents=\"" << descr->getNumberOfComponents() << "\" "
                  "format=\"ascii\">\n";
      for (const T& mem : container)
      {
        descr->emit(outFile_, mem);
      }
      outFile_ << "\n</DataArray>\n";
    }
    outFile_ <<
      "   </PointData>\n"
      "   <CellData/>\n"
      "  </Piece>\n"
      " </UnstructuredGrid>\n"
      "</VTKFile>\n";
  }